

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O0

void Am_Move_Grow_Outside_Method_proc
               (Am_Object *inter,Am_Object *param_2,Am_Object *event_window,Am_Input_Event *ev)

{
  Am_Value *pAVar1;
  Am_Inter_Location local_60;
  Am_Inter_Location orig_points;
  Am_Object command_obj;
  Am_Inter_Internal_Method inter_method;
  Am_Object local_30;
  Am_Object object;
  Am_Input_Event *ev_local;
  Am_Object *event_window_local;
  Am_Object *param_1_local;
  Am_Object *inter_local;
  
  object.data = (Am_Object_Data *)ev;
  Am_Object::Am_Object(&local_30);
  pAVar1 = Am_Object::Get(inter,0x11a,0);
  Am_Object::operator=(&local_30,pAVar1);
  Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)&command_obj);
  pAVar1 = Am_Object::Get(&Am_Interactor,0xc0,0);
  Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&command_obj,pAVar1);
  (*(code *)inter_method.from_wrapper)(inter,&local_30,event_window,object.data);
  Am_Object::Am_Object((Am_Object *)&orig_points);
  pAVar1 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=((Am_Object *)&orig_points,pAVar1);
  Am_Inter_Location::Am_Inter_Location(&local_60);
  pAVar1 = Am_Object::Get(inter,0x16c,0);
  Am_Inter_Location::operator=(&local_60,pAVar1);
  Am_Inter_Call_Both_Method
            (inter,(Am_Object *)&orig_points,0xc9,*(int *)&(object.data)->prototype,
             *(int *)((long)&(object.data)->prototype + 4),event_window,(Am_Input_Char *)object.data
             ,&local_30,&local_60);
  Am_Inter_Location::~Am_Inter_Location(&local_60);
  Am_Object::~Am_Object((Am_Object *)&orig_points);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Move_Grow_Outside_Method,
                 (Am_Object & inter, Am_Object & /* object */,
                  Am_Object &event_window, Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Move_Grow Outside");

  // ignore object parameter, used saved object
  Am_Object object;
  object = inter.Get(Am_START_OBJECT);

  // first, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_OUTSIDE_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  // Now, call the abort Command method
  Am_Object command_obj;
  command_obj = inter.Get(Am_COMMAND);
  Am_Inter_Location orig_points;
  orig_points = inter.Get(Am_OLD_VALUE);
  Am_Inter_Call_Both_Method(inter, command_obj, Am_ABORT_DO_METHOD, ev->x,
                            ev->y, event_window, ev->input_char, object,
                            orig_points);
}